

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O0

float If_CutPowerRefed(If_Man_t *p,If_Cut_t *pCut,If_Obj_t *pRoot)

{
  float fVar1;
  float aResult2;
  float aResult;
  If_Obj_t *pRoot_local;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  if (*(uint *)&pCut->field_0x1c >> 0x18 < 2) {
    p_local._4_4_ = 0.0;
  }
  else {
    fVar1 = If_CutPowerDeref(p,pCut,pRoot);
    p_local._4_4_ = If_CutPowerRef(p,pCut,pRoot);
    if (p_local._4_4_ <= fVar1 - p->fEpsilon) {
      __assert_fail("aResult > aResult2 - p->fEpsilon",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                    ,0x538,"float If_CutPowerRefed(If_Man_t *, If_Cut_t *, If_Obj_t *)");
    }
    if (fVar1 + p->fEpsilon <= p_local._4_4_) {
      __assert_fail("aResult < aResult2 + p->fEpsilon",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                    ,0x539,"float If_CutPowerRefed(If_Man_t *, If_Cut_t *, If_Obj_t *)");
    }
  }
  return p_local._4_4_;
}

Assistant:

float If_CutPowerRefed( If_Man_t * p, If_Cut_t * pCut, If_Obj_t * pRoot )
{
    float aResult, aResult2;
    if ( pCut->nLeaves < 2 )
        return 0;
    aResult2 = If_CutPowerDeref( p, pCut, pRoot );
    aResult  = If_CutPowerRef( p, pCut, pRoot );
    assert( aResult > aResult2 - p->fEpsilon );
    assert( aResult < aResult2 + p->fEpsilon );
    return aResult;
}